

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::translation(Matrix4f *__return_storage_ptr__,Vector3f *rTranslation)

{
  float m03;
  float m13;
  float m23;
  Vector3f *rTranslation_local;
  
  m03 = Vector3f::x(rTranslation);
  m13 = Vector3f::y(rTranslation);
  m23 = Vector3f::z(rTranslation);
  Matrix4f(__return_storage_ptr__,1.0,0.0,0.0,m03,0.0,1.0,0.0,m13,0.0,0.0,1.0,m23,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::translation( const Vector3f& rTranslation )
{
	return Matrix4f
	(
		1, 0, 0, rTranslation.x(),
		0, 1, 0, rTranslation.y(),
		0, 0, 1, rTranslation.z(),
		0, 0, 0, 1
	);
}